

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::IntField::IntField(IntField *this,int field)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  FieldBase::FieldBase(&this->super_FieldBase,field,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001fcc38;
  return;
}

Assistant:

IntField(int field)
      : FieldBase(field, "") {}